

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

int __thiscall
Minisat::Solver::computeLBD<Minisat::vec<Minisat::Lit>>(Solver *this,vec<Minisat::Lit> *c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Lit *pLVar4;
  unsigned_long *puVar5;
  vec<Minisat::Lit> *in_RSI;
  long in_RDI;
  int l;
  int i;
  int assumption_level;
  int lbd;
  unsigned_long in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int local_24;
  int local_1c;
  int local_4;
  
  iVar1 = vec<Minisat::Lit>::size(in_RSI);
  if (*(int *)(in_RDI + 0x47c) < iVar1) {
    local_4 = vec<Minisat::Lit>::size(in_RSI);
  }
  else {
    local_1c = 0;
    iVar1 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x3c0));
    *(long *)(in_RDI + 0x5d0) = *(long *)(in_RDI + 0x5d0) + 1;
    local_24 = 0;
    while( true ) {
      iVar3 = local_24;
      iVar2 = vec<Minisat::Lit>::size(in_RSI);
      if (iVar2 <= iVar3) break;
      pLVar4 = vec<Minisat::Lit>::operator[](in_RSI,local_24);
      var((Lit)pLVar4->x);
      iVar3 = level((Solver *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),
                    (Var)(in_stack_ffffffffffffffb8 >> 0x20));
      if (iVar1 < iVar3) {
        puVar5 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0x5c0),iVar3);
        if (*puVar5 != *(unsigned_long *)(in_RDI + 0x5d0)) {
          in_stack_ffffffffffffffb8 = *(unsigned_long *)(in_RDI + 0x5d0);
          puVar5 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0x5c0),iVar3);
          *puVar5 = in_stack_ffffffffffffffb8;
          local_1c = local_1c + 1;
        }
      }
      local_24 = local_24 + 1;
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

int computeLBD(const V &c)
    {
        if (c.size() > max_lbd_calc_size) return c.size();

        int lbd = 0;
        const int assumption_level = assumptions.size(); // ignore anything below
        counter++;
        for (int i = 0; i < c.size(); i++) {
            int l = level(var(c[i]));
            if (l > assumption_level && seen2[l] != counter) {
                seen2[l] = counter;
                lbd++;
            }
        }

        return lbd;
    }